

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  GImGui->ActiveIdIsJustActivated = GImGui->ActiveId != id;
  pIVar1->ActiveId = id;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdIsAlive = (pIVar1->ActiveIdIsAlive & 1U) != 0 || id != 0;
  pIVar1->ActiveIdWindow = window;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdIsAlive |= (id != 0);
    g.ActiveIdWindow = window;
}